

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall
PlanTest::FindWorkSorted(PlanTest *this,deque<Edge_*,_std::allocator<Edge_*>_> *ret,int count)

{
  Test *this_00;
  bool bVar1;
  Edge *pEVar2;
  iterator local_68;
  iterator local_48;
  Edge *local_28;
  Edge *edge;
  int i;
  int count_local;
  deque<Edge_*,_std::allocator<Edge_*>_> *ret_local;
  PlanTest *this_local;
  
  edge._0_4_ = 0;
  edge._4_4_ = count;
  _i = ret;
  ret_local = (deque<Edge_*,_std::allocator<Edge_*>_> *)this;
  while( true ) {
    this_00 = g_current_test;
    if (edge._4_4_ <= (int)edge) {
      pEVar2 = Plan::FindWork(&this->plan_);
      bVar1 = testing::Test::Check
                        (this_00,(bool)((pEVar2 != (Edge *)0x0 ^ 0xffU) & 1),
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x30,"plan_.FindWork()");
      if (bVar1) {
        std::deque<Edge_*,_std::allocator<Edge_*>_>::begin(&local_48,_i);
        std::deque<Edge_*,_std::allocator<Edge_*>_>::end(&local_68,_i);
        std::sort<std::_Deque_iterator<Edge*,Edge*&,Edge**>,bool(*)(Edge_const*,Edge_const*)>
                  (&local_48,&local_68,CompareEdgesByOutput::cmp);
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
      }
      return;
    }
    bVar1 = Plan::more_to_do(&this->plan_);
    bVar1 = testing::Test::Check
                      (this_00,bVar1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x2b,"plan_.more_to_do()");
    if (!bVar1) break;
    local_28 = Plan::FindWork(&this->plan_);
    bVar1 = testing::Test::Check
                      (g_current_test,local_28 != (Edge *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x2d,"edge");
    if (!bVar1) {
      testing::Test::AddAssertionFailure(g_current_test);
      return;
    }
    std::deque<Edge_*,_std::allocator<Edge_*>_>::push_back(_i,&local_28);
    edge._0_4_ = (int)edge + 1;
  }
  testing::Test::AddAssertionFailure(g_current_test);
  return;
}

Assistant:

void FindWorkSorted(deque<Edge*>* ret, int count) {
    for (int i = 0; i < count; ++i) {
      ASSERT_TRUE(plan_.more_to_do());
      Edge* edge = plan_.FindWork();
      ASSERT_TRUE(edge);
      ret->push_back(edge);
    }
    ASSERT_FALSE(plan_.FindWork());
    sort(ret->begin(), ret->end(), CompareEdgesByOutput::cmp);
  }